

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O1

_Bool create_deviceSASObject
                (HTTPTRANSPORT_PERDEVICE_DATA *handleData,STRING_HANDLE hostName,char *deviceId,
                char *deviceKey)

{
  int iVar1;
  STRING_HANDLE s2;
  STRING_HANDLE handle;
  LOGGER_LOG p_Var2;
  STRING_HANDLE key;
  HTTPAPIEX_SAS_HANDLE pHVar3;
  char *pcVar4;
  _Bool _Var5;
  
  s2 = URL_EncodeString(deviceId);
  if (s2 == (STRING_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"create_deviceSASObject",0x220,1,"URL_EncodeString keyname failed");
      return false;
    }
    return false;
  }
  handle = STRING_clone(hostName);
  if (handle == (STRING_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      _Var5 = false;
    }
    else {
      _Var5 = false;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"create_deviceSASObject",0x24a,1,"STRING_staticclone uri resource failed");
    }
    goto LAB_0012d274;
  }
  iVar1 = STRING_concat(handle,"/devices/");
  if ((iVar1 == 0) && (iVar1 = STRING_concat_with_STRING(handle,s2), iVar1 == 0)) {
    key = STRING_construct(deviceKey);
    if (key == (STRING_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0012d243;
      pcVar4 = "STRING_construct Key failed";
      iVar1 = 0x23d;
LAB_0012d12b:
      _Var5 = false;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"create_deviceSASObject",iVar1,1,pcVar4);
    }
    else {
      iVar1 = STRING_empty(s2);
      if (iVar1 == 0) {
        pHVar3 = HTTPAPIEX_SAS_Create(key,handle,s2);
        handleData->sasObject = pHVar3;
        _Var5 = pHVar3 != (HTTPAPIEX_SAS_HANDLE)0x0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) {
          _Var5 = false;
        }
        else {
          _Var5 = false;
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                    ,"create_deviceSASObject",0x231,1,
                    "Unable to form the device key name for the SAS");
        }
      }
      STRING_delete(key);
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar4 = "STRING_concat uri resource failed";
      iVar1 = 0x243;
      goto LAB_0012d12b;
    }
LAB_0012d243:
    _Var5 = false;
  }
  STRING_delete(handle);
LAB_0012d274:
  STRING_delete(s2);
  return _Var5;
}

Assistant:

static bool create_deviceSASObject(HTTPTRANSPORT_PERDEVICE_DATA* handleData, STRING_HANDLE hostName, const char * deviceId, const char * deviceKey)
{
    STRING_HANDLE keyName;
    bool result;
    keyName = URL_EncodeString(deviceId);
    if (keyName == NULL)
    {
        LogError("URL_EncodeString keyname failed");
        result = false;
    }
    else
    {
        STRING_HANDLE uriResource;
        uriResource = STRING_clone(hostName);
        if (uriResource != NULL)
        {
            if ((STRING_concat(uriResource, "/devices/") == 0) &&
                (STRING_concat_with_STRING(uriResource, keyName) == 0))
            {
                STRING_HANDLE key = STRING_construct(deviceKey);
                if (key != NULL)
                {
                    if (STRING_empty(keyName) != 0)
                    {
                        LogError("Unable to form the device key name for the SAS");
                        result = false;
                    }
                    else
                    {
                        handleData->sasObject = HTTPAPIEX_SAS_Create(key, uriResource, keyName);
                        result = (handleData->sasObject != NULL) ? (true) : (false);
                    }
                    STRING_delete(key);
                }
                else
                {
                    LogError("STRING_construct Key failed");
                    result = false;
                }
            }
            else
            {
                LogError("STRING_concat uri resource failed");
                result = false;
            }
            STRING_delete(uriResource);
        }
        else
        {
            LogError("STRING_staticclone uri resource failed");
            result = false;
        }
        STRING_delete(keyName);
    }
    return result;
}